

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::QuantizationParams::clear_QuantizationType(QuantizationParams *this)

{
  QuantizationTypeCase QVar1;
  QuantizationParams *this_local;
  
  QVar1 = QuantizationType_case(this);
  if (QVar1 != QUANTIZATIONTYPE_NOT_SET) {
    if (QVar1 == kLinearQuantization) {
      if ((this->QuantizationType_).linearquantization_ != (LinearQuantizationParams *)0x0) {
        (*(((this->QuantizationType_).linearquantization_)->super_MessageLite)._vptr_MessageLite[1])
                  ();
      }
    }
    else if ((QVar1 == kLookupTableQuantization) &&
            ((this->QuantizationType_).linearquantization_ != (LinearQuantizationParams *)0x0)) {
      (*(((this->QuantizationType_).linearquantization_)->super_MessageLite)._vptr_MessageLite[1])()
      ;
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void QuantizationParams::clear_QuantizationType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.QuantizationParams)
  switch (QuantizationType_case()) {
    case kLinearQuantization: {
      delete QuantizationType_.linearquantization_;
      break;
    }
    case kLookupTableQuantization: {
      delete QuantizationType_.lookuptablequantization_;
      break;
    }
    case QUANTIZATIONTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = QUANTIZATIONTYPE_NOT_SET;
}